

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void backtracer_anything(t_backtracer *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined4 uVar1;
  t_msgstack *fatso;
  t_atom *ptVar2;
  t_atom *ptVar3;
  int local_44;
  int local_40;
  int i;
  int ncopy;
  _outconnect *oc;
  t_msgstack *m;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_backtracer *x_local;
  
  fatso = (t_msgstack *)getbytes(0x70);
  local_44 = argc;
  if (5 < argc) {
    local_44 = 5;
  }
  fatso->m_next = backtracer_stack;
  backtracer_stack = fatso;
  fatso->m_sel = s;
  fatso->m_argc = argc;
  for (local_40 = 0; local_40 < local_44; local_40 = local_40 + 1) {
    ptVar2 = fatso->m_argv + local_40;
    ptVar3 = argv + local_40;
    uVar1 = *(undefined4 *)&ptVar3->field_0x4;
    ptVar2->a_type = ptVar3->a_type;
    *(undefined4 *)&ptVar2->field_0x4 = uVar1;
    ptVar2->a_w = ptVar3->a_w;
  }
  fatso->m_owner = x;
  if (backtracer_tracing != 0) {
    backtracer_printmsg(x->b_owner,s,argc,argv);
  }
  for (_i = x->b_connections; _i != (_outconnect *)0x0; _i = _i->oc_next) {
    pd_typedmess(_i->oc_to,s,argc,argv);
  }
  backtracer_stack = fatso->m_next;
  freebytes(fatso,0x70);
  return;
}

Assistant:

static void backtracer_anything(t_backtracer *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_msgstack *m = (t_msgstack *)t_getbytes(sizeof(t_msgstack));
    t_outconnect *oc;
    int ncopy = (argc > NARGS ? NARGS : argc), i;
    m->m_next = backtracer_stack;
    backtracer_stack = m;
    m->m_sel = s;
    m->m_argc = argc;
    for (i = 0; i < ncopy; i++)
        m->m_argv[i] = argv[i];
    m->m_owner = x;
    if (backtracer_tracing)
        backtracer_printmsg(x->b_owner, s, argc, argv);
    for (oc = x->b_connections; oc; oc = oc->oc_next)
        typedmess(oc->oc_to, s, argc, argv);
    backtracer_stack = m->m_next;
    t_freebytes(m, sizeof(*m));
}